

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type,
          bool throw_if_missing)

{
  PyTypeObject *t;
  long *plVar1;
  size_type *psVar2;
  anon_union_24_2_63b86169_for_instance_1 *paVar3;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar4;
  values_and_holders vhs;
  iterator it;
  allocator local_132;
  allocator local_131;
  _Alloc_hider local_130;
  size_type local_128;
  char local_120 [8];
  undefined8 in_stack_fffffffffffffee8;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  values_and_holders local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  iterator local_60;
  
  if (find_type == (type_info *)0x0) {
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = (type_info *)0x0;
  }
  else {
    t = (this->ob_base).ob_type;
    if (t != find_type->type) {
      local_90.inst = this;
      pVar4 = all_type_info_get_cache((PyTypeObject *)in_stack_fffffffffffffee8);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        all_type_info_populate
                  (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                      *)((long)pVar4.first.
                               super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                               ._M_cur.
                               super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                        + 0x10));
      }
      local_90.tinfo =
           (type_vec *)
           ((long)pVar4.first.
                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                  ._M_cur.
                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
           + 0x10);
      values_and_holders::find(&local_60,&local_90,find_type);
      if (CONCAT44(local_60.curr.index._4_4_,(undefined4)local_60.curr.index) ==
          (long)((local_90.tinfo)->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)((local_90.tinfo)->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3) {
        if (throw_if_missing) {
          std::__cxx11::string::string((string *)&local_80,find_type->type->tp_name,&local_131);
          std::operator+(&local_d0,"pybind11::detail::instance::get_value_and_holder: `",&local_80);
          plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_130._M_p = (pointer)*plVar1;
          psVar2 = (size_type *)(plVar1 + 2);
          if ((size_type *)local_130._M_p == psVar2) {
            local_120 = (char  [8])*psVar2;
            local_130._M_p = local_120;
          }
          else {
            local_120 = (char  [8])*psVar2;
          }
          local_128 = plVar1[1];
          *plVar1 = (long)psVar2;
          plVar1[1] = 0;
          *(undefined1 *)(plVar1 + 2) = 0;
          std::__cxx11::string::string
                    ((string *)&local_f0,((this->ob_base).ob_type)->tp_name,&local_132);
          std::operator+(&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_130,&local_f0);
          plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_110._M_dataplus._M_p = (pointer)*plVar1;
          psVar2 = (size_type *)(plVar1 + 2);
          if ((size_type *)local_110._M_dataplus._M_p == psVar2) {
            local_110.field_2._M_allocated_capacity = *psVar2;
            local_110.field_2._8_8_ = plVar1[3];
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar2;
          }
          local_110._M_string_length = plVar1[1];
          *plVar1 = (long)psVar2;
          plVar1[1] = 0;
          *(undefined1 *)(plVar1 + 2) = 0;
          pybind11_fail(&local_110);
        }
        local_60.curr.inst._0_4_ = 0;
        local_60.curr.inst._4_4_ = 0;
        local_60.curr.index._0_4_ = 0;
        local_60.curr.index._4_4_ = 0;
        __return_storage_ptr__->type = (type_info *)0x0;
        __return_storage_ptr__->vh = (void **)0x0;
      }
      else {
        __return_storage_ptr__->type = local_60.curr.type;
        __return_storage_ptr__->vh = local_60.curr.vh;
      }
      *(undefined4 *)&__return_storage_ptr__->inst = local_60.curr.inst._0_4_;
      *(undefined4 *)((long)&__return_storage_ptr__->inst + 4) = local_60.curr.inst._4_4_;
      *(undefined4 *)&__return_storage_ptr__->index = (undefined4)local_60.curr.index;
      *(undefined4 *)((long)&__return_storage_ptr__->index + 4) = local_60.curr.index._4_4_;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = find_type;
  }
  if ((this->field_0x30 & 2) == 0) {
    paVar3 = (anon_union_24_2_63b86169_for_instance_1 *)(this->field_1).simple_value_holder[0];
  }
  else {
    paVar3 = &this->field_1;
  }
  __return_storage_ptr__->vh = (void **)paVar3;
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE inline value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/, bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

    if (!throw_if_missing)
        return value_and_holder();

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            std::string(find_type->type->tp_name) + "' is not a pybind11 base of the given `" +
            std::string(Py_TYPE(this)->tp_name) + "' instance");
#endif
}